

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AStarFringe.cpp
# Opt level: O0

bool __thiscall AStarFringe::insertInFringe(AStarFringe *this,sptr *node)

{
  Heuristic *pHVar1;
  mapped_type mVar2;
  bool bVar3;
  element_type *peVar4;
  Board *pBVar5;
  vector<Direction,_std::allocator<Direction>_> *this_00;
  size_type sVar6;
  mapped_type *pmVar7;
  undefined1 auVar8 [16];
  value_type local_58;
  double local_40;
  double leastNodeCost;
  mapped_type local_30;
  double cost;
  size_t hash;
  sptr *node_local;
  AStarFringe *this_local;
  
  hash = (size_t)node;
  node_local = (sptr *)this;
  peVar4 = std::__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      node);
  pBVar5 = SearchNode::getBoard(peVar4);
  cost = (double)Board::hash(pBVar5);
  peVar4 = std::__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      hash);
  this_00 = SearchNode::getPath(peVar4);
  sVar6 = std::vector<Direction,_std::allocator<Direction>_>::size(this_00);
  auVar8._8_4_ = (int)(sVar6 >> 0x20);
  auVar8._0_8_ = sVar6;
  auVar8._12_4_ = 0x45300000;
  pHVar1 = this->heuristic;
  peVar4 = std::__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      hash);
  pBVar5 = SearchNode::getBoard(peVar4);
  local_30 = (*pHVar1)(pBVar5);
  local_30 = (auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0) + local_30;
  peVar4 = std::__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<SearchNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      hash);
  pBVar5 = SearchNode::getBoard(peVar4);
  leastNodeCost = (double)Board::hash(pBVar5);
  bVar3 = std::
          unordered_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          ::contains(&this->leastCosts,(key_type *)&leastNodeCost);
  if (bVar3) {
    pmVar7 = std::
             unordered_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::operator[](&this->leastCosts,(key_type *)&cost);
    local_40 = *pmVar7;
    if (local_40 <= local_30) {
      return false;
    }
  }
  std::shared_ptr<SearchNode>::shared_ptr(&local_58.node,(shared_ptr<SearchNode> *)hash);
  local_58.cost = local_30;
  std::
  priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
  ::push(&this->fringe,&local_58);
  Node::~Node(&local_58);
  mVar2 = local_30;
  pmVar7 = std::
           unordered_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
           ::operator[](&this->leastCosts,(key_type *)&cost);
  *pmVar7 = mVar2;
  return true;
}

Assistant:

bool AStarFringe::insertInFringe(const SearchNode::sptr& node) {
    size_t hash = node->getBoard().hash();
    double cost = node->getPath().size() + heuristic(node->getBoard());

    if (leastCosts.contains(node->getBoard().hash())) {
        double leastNodeCost = leastCosts[hash];

        if (leastNodeCost <= cost) {
            // Already seen a cheaper node with the same board state, discard
            return false;
        }
    }

    fringe.push({ node, cost });
    leastCosts[hash] = cost;

    return true;
}